

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

void __thiscall
slang::ast::builtins::AssocArrayExistsMethod::AssocArrayExistsMethod(AssocArrayExistsMethod *this)

{
  undefined8 *in_RDI;
  SubroutineKind in_stack_00000028;
  KnownSystemName in_stack_0000002c;
  SystemSubroutine *in_stack_00000030;
  
  SystemSubroutine::SystemSubroutine(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  *in_RDI = &PTR__AssocArrayExistsMethod_01a29eb0;
  return;
}

Assistant:

AssocArrayExistsMethod() :
        SystemSubroutine(KnownSystemName::Exists, SubroutineKind::Function) {}